

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::getHandleFederate(CommonCore *this,InterfaceHandle handle)

{
  bool bVar1;
  MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  anon_class_4_1_58265f66 *in_RDI;
  handle feds;
  type local_fed_id;
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff88;
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *this_01;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_ffffffffffffffb8;
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  local_38;
  LocalFederateId local_1c [5];
  FederateState *local_8;
  
  local_1c[0].fid =
       (BaseType)
       gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
       read<helics::CommonCore::getHandleFederate(helics::InterfaceHandle)::__0>
                 (in_stack_ffffffffffffffb8,in_RDI);
  bVar1 = LocalFederateId::isValid(local_1c);
  if (bVar1) {
    this_01 = &local_38;
    gmlc::libguarded::
    shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff88);
    this_00 = gmlc::libguarded::
              lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
              ::operator*(this_01);
    LocalFederateId::baseValue(local_1c);
    local_8 = gmlc::containers::
              MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](this_00,(size_t)this_01);
    gmlc::libguarded::
    lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                    *)0x4669ed);
  }
  else {
    local_8 = (FederateState *)0x0;
  }
  return local_8;
}

Assistant:

FederateState* CommonCore::getHandleFederate(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        auto feds = federates.lock();
        return (*feds)[local_fed_id.baseValue()];
    }

    return nullptr;
}